

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_dx_iface.c
# Opt level: O2

aom_codec_err_t ctrl_get_last_ref_updates(aom_codec_alg_priv_t *ctx,__va_list_tag *args)

{
  uint uVar1;
  aom_codec_err_t aVar2;
  undefined8 *puVar3;
  
  uVar1 = args->gp_offset;
  if ((ulong)uVar1 < 0x29) {
    puVar3 = (undefined8 *)((ulong)uVar1 + (long)args->reg_save_area);
    args->gp_offset = uVar1 + 8;
  }
  else {
    puVar3 = (undefined8 *)args->overflow_arg_area;
    args->overflow_arg_area = puVar3 + 1;
  }
  if ((undefined4 *)*puVar3 == (undefined4 *)0x0) {
    aVar2 = AOM_CODEC_INVALID_PARAM;
  }
  else {
    if (ctx->frame_worker != (AVxWorker *)0x0) {
      *(undefined4 *)*puVar3 = *(undefined4 *)(*ctx->frame_worker->data1 + 0x3b84);
      return AOM_CODEC_OK;
    }
    aVar2 = AOM_CODEC_ERROR;
  }
  return aVar2;
}

Assistant:

static aom_codec_err_t ctrl_get_last_ref_updates(aom_codec_alg_priv_t *ctx,
                                                 va_list args) {
  int *const update_info = va_arg(args, int *);

  if (update_info) {
    if (ctx->frame_worker) {
      AVxWorker *const worker = ctx->frame_worker;
      FrameWorkerData *const frame_worker_data =
          (FrameWorkerData *)worker->data1;
      *update_info =
          frame_worker_data->pbi->common.current_frame.refresh_frame_flags;
      return AOM_CODEC_OK;
    } else {
      return AOM_CODEC_ERROR;
    }
  }

  return AOM_CODEC_INVALID_PARAM;
}